

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int value;
  int value_00;
  Edition EVar1;
  ushort *puVar2;
  FeatureSet *from;
  FeatureSet *this_00;
  EnumValueDescriptor *this_01;
  ReservedRange *pRVar3;
  Arg *a0;
  SymbolVisibility *visibility;
  char *pcVar4;
  int i;
  int iVar5;
  long lVar6;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view src;
  string prefix;
  uint local_1a4;
  Arg local_1a0;
  string local_170;
  Arg local_150;
  EnumOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)prefix._M_string_length;
  full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)prefix._M_dataplus._M_p;
  local_1a4 = (byte)this->field_0x1 >> 2 & 3;
  protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
            (&local_170,(_anonymous_namespace_ *)&local_1a4,visibility);
  local_1a0.piece_._M_len = local_170._M_string_length;
  local_1a0.piece_._M_str = local_170._M_dataplus._M_p;
  puVar2 = (ushort *)(this->all_names_).payload_;
  local_150.piece_._M_len = (size_t)*puVar2;
  local_150.piece_._M_str = (char *)((long)puVar2 + ~local_150.piece_._M_len);
  format_06._M_str = (char *)&full_options;
  format_06._M_len = (size_t)"$0$1enum $2 {\n";
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)&DAT_0000000e,format_06,&local_1a0,
             &local_150,(Arg *)prefix._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_170);
  EnumOptions::EnumOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)&_FeatureSet_default_instance_) {
    this_00 = EnumOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  anon_unknown_24::FormatLineOptions
            (depth + 1,&full_options.super_Message,this->file_->pool_,contents);
  for (iVar5 = 0; iVar5 < this->value_count_; iVar5 = iVar5 + 1) {
    this_01 = EnumDescriptor::value(this,iVar5);
    EnumValueDescriptor::DebugString(this_01,depth + 1,contents,debug_string_options);
  }
  if (0 < this->reserved_range_count_) {
    local_1a0.piece_._M_len = prefix._M_string_length;
    local_1a0.piece_._M_str = prefix._M_dataplus._M_p;
    format._M_str = "$0  reserved ";
    format._M_len = 0xd;
    absl::lts_20250127::SubstituteAndAppend(contents,format,&local_1a0);
    for (iVar5 = 0; iVar5 < this->reserved_range_count_; iVar5 = iVar5 + 1) {
      pRVar3 = reserved_range(this,iVar5);
      value = pRVar3->start;
      value_00 = pRVar3->end;
      if (value_00 == value) {
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_1a0,value_00);
        format_00._M_str = "$0, ";
        format_00._M_len = 4;
        absl::lts_20250127::SubstituteAndAppend(contents,format_00,&local_1a0);
      }
      else if (value_00 == 0x7fffffff) {
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_1a0,value);
        format_01._M_str = "$0 to max, ";
        format_01._M_len = 0xb;
        absl::lts_20250127::SubstituteAndAppend(contents,format_01,&local_1a0);
      }
      else {
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_1a0,value);
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_150,pRVar3->end);
        format_02._M_str = "$0 to $1, ";
        format_02._M_len = 10;
        absl::lts_20250127::SubstituteAndAppend(contents,format_02,&local_1a0,&local_150);
      }
    }
    std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
  }
  if (0 < this->reserved_name_count_) {
    a0 = &local_1a0;
    local_1a0.piece_._M_len = prefix._M_string_length;
    local_1a0.piece_._M_str = prefix._M_dataplus._M_p;
    format_03._M_str = "$0  reserved ";
    format_03._M_len = 0xd;
    absl::lts_20250127::SubstituteAndAppend(contents,format_03,a0);
    for (lVar6 = 0; lVar6 < this->reserved_name_count_; lVar6 = lVar6 + 1) {
      EVar1 = this->file_->edition_;
      src._M_str = (char *)a0;
      src._M_len = (size_t)(this->reserved_names_[lVar6]->_M_dataplus)._M_p;
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)&local_150,(lts_20250127 *)this->reserved_names_[lVar6]->_M_string_length
                 ,src);
      pcVar4 = "$0, ";
      if ((int)EVar1 < 1000) {
        pcVar4 = "\"$0\", ";
      }
      local_1a0.piece_._M_len = (size_t)local_150.piece_._M_str;
      local_1a0.piece_._M_str = (char *)local_150.piece_._M_len;
      format_04._M_str = pcVar4;
      format_04._M_len = (ulong)((int)EVar1 < 1000) * 2 + 4;
      a0 = &local_1a0;
      absl::lts_20250127::SubstituteAndAppend(contents,format_04,&local_1a0);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
  }
  local_1a0.piece_._M_len = prefix._M_string_length;
  local_1a0.piece_._M_str = prefix._M_dataplus._M_p;
  format_05._M_str = "$0}\n";
  format_05._M_len = 4;
  absl::lts_20250127::SubstituteAndAppend(contents,format_05,&local_1a0);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  EnumOptions::~EnumOptions(&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1enum $2 {\n", prefix,
                            VisibilityToKeyword(visibility_keyword()), name());

  EnumOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}